

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O2

void ColorTracker::showImg(Mat *img)

{
  allocator local_49;
  string local_48 [32];
  _InputArray local_28;
  
  std::__cxx11::string::string(local_48,"showImg",&local_49);
  local_28.sz.width = 0;
  local_28.sz.height = 0;
  local_28.flags = 0x1010000;
  local_28.obj = img;
  cv::imshow(local_48,&local_28);
  std::__cxx11::string::~string(local_48);
  cv::waitKey(0);
  cv::destroyAllWindows();
  return;
}

Assistant:

void ColorTracker::showImg(const Mat& img){
    cv::imshow("showImg",img);
    cv::waitKey(0);
    cv::destroyAllWindows();
}